

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BasicFileSystem.cpp
# Opt level: O2

void Diligent::BasicFileSystem::CorrectSlashes(String *Path,Char Slash)

{
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __first;
  int iVar1;
  undefined7 in_register_00000031;
  Char Slash_local;
  Char RevSlashSym;
  undefined7 uStack_37;
  
  iVar1 = (int)CONCAT71(in_register_00000031,Slash);
  if (iVar1 == 0) {
    Slash_local = '/';
    RevSlashSym = '\\';
  }
  else {
    Slash_local = Slash;
    if ((iVar1 != 0x2f) && (iVar1 != 0x5c)) {
      FormatString<char[23]>((string *)&RevSlashSym,(char (*) [23])"Incorrect slash symbol");
      DebugAssertionFailed
                ((Char *)CONCAT71(uStack_37,RevSlashSym),"CorrectSlashes",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Platforms/Basic/src/BasicFileSystem.cpp"
                 ,99);
      std::__cxx11::string::~string((string *)&RevSlashSym);
    }
    RevSlashSym = '\\';
    if (Slash == '\\') {
      RevSlashSym = '/';
    }
  }
  __first._M_current = (Path->_M_dataplus)._M_p;
  std::replace<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
            (__first,(__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      )(__first._M_current + Path->_M_string_length),&RevSlashSym,&Slash_local);
  return;
}

Assistant:

void BasicFileSystem::CorrectSlashes(String& Path, Char Slash)
{
    if (Slash != 0)
        DEV_CHECK_ERR(IsSlash(Slash), "Incorrect slash symbol");
    else
        Slash = SlashSymbol;
    Char RevSlashSym = (Slash == '\\') ? '/' : '\\';
    std::replace(Path.begin(), Path.end(), RevSlashSym, Slash);
}